

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_opc_special3_r6(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx;
  uint uVar1;
  uint uVar2;
  uintptr_t o;
  TCGv_i32 pTVar3;
  uint base;
  uint op;
  uint opc;
  uint32_t opc_00;
  MemOp_conflict2 tcg_mo;
  int iVar4;
  uint rd;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  TCGTemp *local_38;
  
  uVar1 = (uint)(env->active_tc).gpr[7];
  base = uVar1 >> 0x15 & 0x1f;
  op = uVar1 >> 0x10 & 0x1f;
  iVar4 = (int)(short)uVar1 >> 7;
  uVar2 = uVar1 & 0xfc00003f;
  if (7 < uVar2 + 0x83ffffe0) {
    switch(uVar2) {
    case 0x7c000035:
      if (op < 0x18) {
        return;
      }
      break;
    case 0x7c000036:
      opc_00 = 0x7c000036;
      goto LAB_009b9ab6;
    case 0x7c000037:
      opc_00 = 0x7c000037;
LAB_009b9ab6:
      gen_ld((DisasContext_conflict6 *)env,opc_00,op,base,iVar4);
      return;
    case 0x7c00003d:
      tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      if ((int)(env->active_tc).gpr[0x14] < 2) {
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      if (((env->active_tc).gpr[0xc] & 0x10) == 0) {
        generate_exception_err((DisasContext_conflict6 *)env,0x13,0);
      }
      uVar1 = (uint)(env->active_tc).gpr[7];
      uVar2 = uVar1 >> 6 & 3;
      if (uVar2 == 0) {
        return;
      }
      if (uVar2 == 2) {
        pTVar3 = tcg_const_i32_mips64el(tcg_ctx,uVar1 >> 8 & 3);
        local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_40 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[base]);
        local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
        tcg_gen_callN_mips64el(tcg_ctx,helper_ginvt_mips64el,(TCGTemp *)0x0,3,&local_48);
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
        return;
      }
    }
switchD_009b9971_caseD_7c000021:
    generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    return;
  }
  rd = uVar1 >> 0xb & 0x1f;
  switch(uVar2) {
  case 0x7c000020:
    if (rd == 0) {
      return;
    }
    opc = uVar1 & 0xfc0007ff;
    uVar2 = (opc + 0x83ffffe0) * 0x4000000 | opc + 0x83ffffe0 >> 6;
    if (uVar2 - 8 < 4) {
      uVar1 = uVar1 >> 6 & 3;
      iVar4 = 0x20;
LAB_009b9a86:
      gen_align_bits((DisasContext_conflict6 *)env,iVar4,rd,base,op,uVar1 << 3);
      return;
    }
    break;
  default:
    goto switchD_009b9971_caseD_7c000021;
  case 0x7c000024:
    if (((env->active_tc).gpr[0xc] & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    }
    if (rd == 0) {
      return;
    }
    opc = (uint)(env->active_tc).gpr[7] & 0xfc0007ff;
    uVar2 = (opc + 0x83ffffdc) * 0x4000000 | opc + 0x83ffffdc >> 6;
    if (uVar2 - 8 < 8) {
      uVar1 = uVar1 >> 6 & 7;
      iVar4 = 0x40;
      goto LAB_009b9a86;
    }
    break;
  case 0x7c000025:
    if (((env->active_tc).gpr[0xc] & 0x10) == 0) {
      generate_exception_err((DisasContext_conflict6 *)env,0x13,0);
    }
    if ((*(byte *)((long)(env->active_tc).gpr + 99) & 8) == 0) {
      return;
    }
    gen_cache_operation((DisasContext_conflict6 *)env,op,base,(int16_t)iVar4);
    return;
  case 0x7c000026:
    tcg_mo = MO_LESL;
    goto LAB_009b9a2e;
  case 0x7c000027:
    tcg_mo = MO_64;
LAB_009b9a2e:
    gen_st_cond((DisasContext_conflict6 *)env,op,base,iVar4,tcg_mo,false);
    return;
  }
  if (uVar2 != 0) {
    return;
  }
  gen_bitswap((DisasContext_conflict6 *)env,opc,rd,op);
  return;
}

Assistant:

static void decode_opc_special3_r6(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, rt, rd, sa;
    uint32_t op1, op2;
    int16_t imm;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;
    imm = (int16_t)ctx->opcode >> 7;

    op1 = MASK_SPECIAL3(ctx->opcode);
    switch (op1) {
    case R6_OPC_PREF:
        if (rt >= 24) {
            /* hint codes 24-31 are reserved and signal RI */
            generate_exception_end(ctx, EXCP_RI);
        }
        /* Treat as NOP. */
        break;
    case R6_OPC_CACHE:
        check_cp0_enabled(ctx);
        if (ctx->hflags & MIPS_HFLAG_ITC_CACHE) {
            gen_cache_operation(ctx, rt, rs, imm);
        }
        break;
    case R6_OPC_SC:
        gen_st_cond(ctx, rt, rs, imm, MO_TESL, false);
        break;
    case R6_OPC_LL:
        gen_ld(ctx, op1, rt, rs, imm);
        break;
    case OPC_BSHFL:
        {
            if (rd == 0) {
                /* Treat as NOP. */
                break;
            }
            op2 = MASK_BSHFL(ctx->opcode);
            switch (op2) {
            case OPC_ALIGN:
            case OPC_ALIGN_1:
            case OPC_ALIGN_2:
            case OPC_ALIGN_3:
                gen_align(ctx, 32, rd, rs, rt, sa & 3);
                break;
            case OPC_BITSWAP:
                gen_bitswap(ctx, op2, rd, rt);
                break;
            }
        }
        break;
    case OPC_GINV:
        if (unlikely(ctx->gi <= 1)) {
            generate_exception_end(ctx, EXCP_RI);
        }
        check_cp0_enabled(ctx);
        switch ((ctx->opcode >> 6) & 3) {
        case 0:    /* GINVI */
            /* Treat as NOP. */
            break;
        case 2:    /* GINVT */
            gen_helper_0e1i(ginvt, tcg_ctx->cpu_gpr[rs], extract32(ctx->opcode, 8, 2));
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#if defined(TARGET_MIPS64)
    case R6_OPC_SCD:
        gen_st_cond(ctx, rt, rs, imm, MO_TEQ, false);
        break;
    case R6_OPC_LLD:
        gen_ld(ctx, op1, rt, rs, imm);
        break;
    case OPC_DBSHFL:
        check_mips_64(ctx);
        {
            if (rd == 0) {
                /* Treat as NOP. */
                break;
            }
            op2 = MASK_DBSHFL(ctx->opcode);
            switch (op2) {
            case OPC_DALIGN:
            case OPC_DALIGN_1:
            case OPC_DALIGN_2:
            case OPC_DALIGN_3:
            case OPC_DALIGN_4:
            case OPC_DALIGN_5:
            case OPC_DALIGN_6:
            case OPC_DALIGN_7:
                gen_align(ctx, 64, rd, rs, rt, sa & 7);
                break;
            case OPC_DBITSWAP:
                gen_bitswap(ctx, op2, rd, rt);
                break;
            }

        }
        break;
#endif
    default:            /* Invalid */
        MIPS_INVAL("special3_r6");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}